

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QList<unsigned_short>>::emplace<QList<unsigned_short>const&>
          (QMovableArrayOps<QList<unsigned_short>> *this,qsizetype i,QList<unsigned_short> *args)

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  Data *pDVar4;
  unsigned_short *puVar5;
  long lVar6;
  long lVar7;
  
  piVar2 = *(int **)this;
  if ((piVar2 != (int *)0x0) && (*piVar2 < 2)) {
    lVar3 = *(long *)(this + 0x10);
    if ((lVar3 == i && piVar2 != (int *)0x0) &&
       (*(long *)(piVar2 + 2) - lVar3 !=
        ((long)(*(long *)(this + 8) - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      lVar6 = *(long *)(this + 8);
      pDVar4 = (args->d).d;
      *(Data **)(lVar6 + lVar3 * 0x18) = pDVar4;
      *(unsigned_short **)(lVar6 + 8 + lVar3 * 0x18) = (args->d).ptr;
      *(qsizetype *)(lVar6 + 0x10 + lVar3 * 0x18) = (args->d).size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00682cbb;
    }
    if (((i == 0) && (piVar2 != (int *)0x0)) &&
       (((long)piVar2 + 0x1fU & 0xfffffffffffffff0) != *(ulong *)(this + 8))) {
      lVar3 = *(long *)(this + 8);
      pDVar4 = (args->d).d;
      *(Data **)(lVar3 + -0x18) = pDVar4;
      *(unsigned_short **)(lVar3 + -0x10) = (args->d).ptr;
      *(qsizetype *)(lVar3 + -8) = (args->d).size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
      goto LAB_00682cbb;
    }
  }
  pDVar4 = (args->d).d;
  puVar5 = (args->d).ptr;
  lVar3 = (args->d).size;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar6 = *(long *)(this + 0x10);
  QArrayDataPointer<QList<unsigned_short>_>::detachAndGrow
            ((QArrayDataPointer<QList<unsigned_short>_> *)this,(uint)(i == 0 && lVar6 != 0),1,
             (QList<unsigned_short> **)0x0,(QArrayDataPointer<QList<unsigned_short>_> *)0x0);
  lVar7 = *(long *)(this + 8);
  if (i == 0 && lVar6 != 0) {
    *(Data **)(lVar7 + -0x18) = pDVar4;
    *(unsigned_short **)(lVar7 + -0x10) = puVar5;
    *(long *)(lVar7 + -8) = lVar3;
    *(long *)(this + 8) = lVar7 + -0x18;
  }
  else {
    plVar1 = (long *)(lVar7 + i * 0x18);
    memmove(plVar1 + 3,(void *)(lVar7 + i * 0x18),(*(long *)(this + 0x10) - i) * 0x18);
    *plVar1 = (long)pDVar4;
    plVar1[1] = (long)puVar5;
    plVar1[2] = lVar3;
  }
LAB_00682cbb:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }